

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O3

int __thiscall llbuild::ninja::Lexer::getNextChar(Lexer *this)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = this->bufferPos;
  pcVar4 = (this->buffer).Data + (this->buffer).Length;
  if (pcVar3 == pcVar4) {
    return -1;
  }
  pcVar1 = pcVar3 + 1;
  this->bufferPos = pcVar1;
  cVar2 = *pcVar3;
  if ((cVar2 != '\r') && (cVar2 != '\n')) {
    this->columnNumber = this->columnNumber + 1;
    return (int)cVar2;
  }
  if ((pcVar1 != pcVar4) && (*pcVar1 == (char)('\x17' - cVar2))) {
    this->bufferPos = pcVar3 + 2;
  }
  this->lineNumber = this->lineNumber + 1;
  this->columnNumber = 0;
  return 10;
}

Assistant:

iterator end() const { return Data + Length; }